

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall OpenMD::MatrixAccumulator::getVariance(MatrixAccumulator *this,ResultType *ret)

{
  uint i;
  long lVar1;
  uint j;
  long lVar2;
  ResultType *pRVar3;
  double dVar4;
  double dVar5;
  
  pRVar3 = &this->Avg2_;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      dVar4 = pRVar3[-1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
              [lVar2];
      dVar5 = (pRVar3->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
              [lVar2] - dVar4 * dVar4;
      dVar4 = 0.0;
      if (0.0 <= dVar5) {
        dVar4 = dVar5;
      }
      (((SquareMatrix<double,_3> *)*(double (*) [3])ret)->super_RectMatrix<double,_3U,_3U>).data_[0]
      [lVar2] = dVar4;
    }
    pRVar3 = (ResultType *)
             ((pRVar3->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
    ret = (ResultType *)((long)ret + 0x18);
  }
  return;
}

Assistant:

void getVariance(ResultType& ret) {
      assert(Count_ != 0);
      for (unsigned int i = 0; i < 3; i++) {
        for (unsigned int j = 0; j < 3; j++) {
          ret(i, j) = (Avg2_(i, j) - Avg_(i, j) * Avg_(i, j));
          if (ret(i, j) < 0) ret(i, j) = 0;
        }
      }
      return;
    }